

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::_::TestMoreStuffImpl>::disposeImpl
          (HeapDisposer<capnp::_::TestMoreStuffImpl> *this,void *pointer)

{
  long *plVar1;
  
  if ((pointer != (void *)0x0) && (plVar1 = *(long **)((long)pointer + 0x28), plVar1 != (long *)0x0)
     ) {
    *(undefined8 *)((long)pointer + 0x28) = 0;
    (**(code **)**(undefined8 **)((long)pointer + 0x20))
              (*(undefined8 **)((long)pointer + 0x20),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }